

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O2

reference __thiscall
slang::SmallVectorBase<slang::ast::DefinitionSymbol::ParameterDecl>::
emplace_back<slang::ast::DefinitionSymbol::ParameterDecl_const&>
          (SmallVectorBase<slang::ast::DefinitionSymbol::ParameterDecl> *this,ParameterDecl *args)

{
  size_t *psVar1;
  SourceLocation *pSVar2;
  size_type sVar3;
  ulong uVar4;
  anon_union_8_3_62382250_for_ParameterDecl_0 aVar5;
  anon_union_8_3_4d6ead1c_for_ParameterDecl_2 aVar6;
  anon_union_8_3_62382250_for_ParameterDecl_0 aVar7;
  anon_union_8_3_62382250_for_ParameterDecl_0 aVar8;
  anon_union_8_3_62382250_for_ParameterDecl_0 aVar9;
  anon_union_8_3_62382250_for_ParameterDecl_0 aVar10;
  anon_union_8_3_62382250_for_ParameterDecl_0 aVar11;
  size_t sVar12;
  char *pcVar13;
  SourceLocation SVar14;
  SourceLocation SVar15;
  size_t sVar16;
  anon_union_8_3_62382250_for_ParameterDecl_0 aVar17;
  anon_union_8_3_62382250_for_ParameterDecl_0 *paVar18;
  anon_union_8_3_62382250_for_ParameterDecl_0 *paVar19;
  anon_union_8_3_62382250_for_ParameterDecl_0 *paVar20;
  anon_union_8_3_62382250_for_ParameterDecl_0 *paVar21;
  EVP_PKEY_CTX *pEVar22;
  EVP_PKEY_CTX *ctx;
  long lVar23;
  anon_union_8_3_62382250_for_ParameterDecl_0 *paVar24;
  
  paVar24 = &this->data_[this->len].field_0;
  if (this->len != this->cap) {
    aVar5 = args->field_0;
    aVar6 = args->field_1;
    aVar7 = (anon_union_8_3_62382250_for_ParameterDecl_0)(args->name)._M_len;
    aVar8 = (anon_union_8_3_62382250_for_ParameterDecl_0)(args->name)._M_str;
    aVar9 = *(anon_union_8_3_62382250_for_ParameterDecl_0 *)&args->location;
    aVar10 = (anon_union_8_3_62382250_for_ParameterDecl_0)(args->attributes)._M_ptr;
    aVar11 = *(anon_union_8_3_62382250_for_ParameterDecl_0 *)&args->isTypeParam;
    paVar24[6] = (anon_union_8_3_62382250_for_ParameterDecl_0)
                 (args->attributes)._M_extent._M_extent_value;
    paVar24[7] = aVar11;
    paVar24[4] = aVar9;
    paVar24[5] = aVar10;
    paVar24[2] = aVar7;
    paVar24[3] = aVar8;
    *paVar24 = aVar5;
    *(anon_union_8_3_4d6ead1c_for_ParameterDecl_2 *)(paVar24 + 1) = aVar6;
    sVar3 = this->len;
    this->len = sVar3 + 1;
    return this->data_ + sVar3;
  }
  if (this->len == 0x1ffffffffffffff) {
    detail::throwLengthError();
  }
  pEVar22 = (EVP_PKEY_CTX *)(this->len + 1);
  uVar4 = this->cap;
  ctx = (EVP_PKEY_CTX *)(uVar4 * 2);
  if (pEVar22 < ctx) {
    pEVar22 = ctx;
  }
  if (0x1ffffffffffffff - uVar4 < uVar4) {
    pEVar22 = (EVP_PKEY_CTX *)0x1ffffffffffffff;
  }
  lVar23 = (long)paVar24 - (long)this->data_;
  paVar18 = (anon_union_8_3_62382250_for_ParameterDecl_0 *)operator_new((long)pEVar22 << 6);
  aVar5 = args->field_0;
  aVar6 = args->field_1;
  sVar12 = (args->name)._M_len;
  pcVar13 = (args->name)._M_str;
  SVar14 = args->location;
  SVar15 = (SourceLocation)(args->attributes)._M_ptr;
  sVar16 = *(size_t *)&args->isTypeParam;
  psVar1 = (size_t *)((long)paVar18 + lVar23 + 0x30);
  *psVar1 = (args->attributes)._M_extent._M_extent_value;
  psVar1[1] = sVar16;
  pSVar2 = (SourceLocation *)((long)paVar18 + lVar23 + 0x20);
  *pSVar2 = SVar14;
  pSVar2[1] = SVar15;
  psVar1 = (size_t *)((long)paVar18 + lVar23 + 0x10);
  *psVar1 = sVar12;
  psVar1[1] = (size_t)pcVar13;
  *(anon_union_8_3_62382250_for_ParameterDecl_0 *)((long)paVar18 + lVar23) = aVar5;
  *(anon_union_8_3_4d6ead1c_for_ParameterDecl_2 *)
   ((anon_union_8_3_62382250_for_ParameterDecl_0 *)((long)paVar18 + lVar23) + 1) = aVar6;
  paVar21 = &this->data_->field_0;
  paVar19 = paVar21 + this->len * 8;
  paVar20 = paVar18;
  if (paVar19 == paVar24) {
    for (; paVar21 != paVar24; paVar21 = paVar21 + 8) {
      aVar5 = *paVar21;
      aVar7 = paVar21[1];
      aVar8 = paVar21[2];
      aVar9 = paVar21[3];
      aVar10 = paVar21[4];
      aVar11 = paVar21[5];
      aVar17 = paVar21[7];
      paVar20[6] = paVar21[6];
      paVar20[7] = aVar17;
      paVar20[4] = aVar10;
      paVar20[5] = aVar11;
      paVar20[2] = aVar8;
      paVar20[3] = aVar9;
      *paVar20 = aVar5;
      paVar20[1] = aVar7;
      paVar20 = paVar20 + 8;
    }
  }
  else {
    for (; paVar21 != paVar24; paVar21 = paVar21 + 8) {
      aVar5 = *paVar21;
      aVar7 = paVar21[1];
      aVar8 = paVar21[2];
      aVar9 = paVar21[3];
      aVar10 = paVar21[4];
      aVar11 = paVar21[5];
      aVar17 = paVar21[7];
      paVar20[6] = paVar21[6];
      paVar20[7] = aVar17;
      paVar20[4] = aVar10;
      paVar20[5] = aVar11;
      paVar20[2] = aVar8;
      paVar20[3] = aVar9;
      *paVar20 = aVar5;
      paVar20[1] = aVar7;
      paVar20 = paVar20 + 8;
    }
    paVar21 = (anon_union_8_3_62382250_for_ParameterDecl_0 *)(lVar23 + (long)paVar18);
    for (; paVar24 != paVar19; paVar24 = paVar24 + 8) {
      aVar5 = *paVar24;
      aVar7 = paVar24[1];
      aVar8 = paVar24[2];
      aVar9 = paVar24[3];
      aVar10 = paVar24[4];
      aVar11 = paVar24[5];
      aVar17 = paVar24[7];
      paVar21[0xe] = paVar24[6];
      paVar21[0xf] = aVar17;
      paVar21[0xc] = aVar10;
      paVar21[0xd] = aVar11;
      paVar21[10] = aVar8;
      paVar21[0xb] = aVar9;
      paVar21[8] = aVar5;
      paVar21[9] = aVar7;
      paVar21 = paVar21 + 8;
    }
  }
  cleanup(this,ctx);
  this->len = this->len + 1;
  this->cap = (size_type)pEVar22;
  this->data_ = (pointer)paVar18;
  return (reference)((long)paVar18 + lVar23);
}

Assistant:

reference emplace_back(Args&&... args) {
        if (len == cap)
            return *emplaceRealloc(end(), std::forward<Args>(args)...);

        new (end()) T(std::forward<Args>(args)...);
        len++;
        return back();
    }